

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_004d1168;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->file_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
            (&(this->file_).super_RepeatedPtrFieldBase,&(from->file_).super_RepeatedPtrFieldBase);
  uVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  (this->error_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    uVar1 = this_00->ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    internal::ArenaStringPtr::Set
              (&this->error_,(ulong)(from->error_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar2);
  }
  this->supported_features_ = from->supported_features_;
  return;
}

Assistant:

CodeGeneratorResponse::CodeGeneratorResponse(const CodeGeneratorResponse& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      file_(from.file_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  error_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    error_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_error()) {
    error_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_error(), 
      GetArenaForAllocation());
  }
  supported_features_ = from.supported_features_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse)
}